

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_pool_init_fixed(nk_pool *pool,void *memory,nk_size size)

{
  nk_size size_local;
  void *memory_local;
  nk_pool *pool_local;
  
  nk_zero(pool,0x48);
  if (size < 0x210) {
    __assert_fail("size >= sizeof(struct nk_page)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3be9,"void nk_pool_init_fixed(struct nk_pool *, void *, nk_size)");
  }
  if (0x20f < size) {
    pool->capacity = (int)size - 0x210U >> 9;
    pool->pages = (nk_page *)memory;
    pool->type = NK_BUFFER_FIXED;
    pool->size = size;
  }
  return;
}

Assistant:

NK_LIB void
nk_pool_init_fixed(struct nk_pool *pool, void *memory, nk_size size)
{
    nk_zero(pool, sizeof(*pool));
    NK_ASSERT(size >= sizeof(struct nk_page));
    if (size < sizeof(struct nk_page)) return;
    pool->capacity = (unsigned)(size - sizeof(struct nk_page)) / sizeof(struct nk_page_element);
    pool->pages = (struct nk_page*)memory;
    pool->type = NK_BUFFER_FIXED;
    pool->size = size;
}